

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O1

Background * __thiscall
Rml::ElementBackgroundBorder::GetOrCreateBackground
          (ElementBackgroundBorder *this,BackgroundType type)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Background *pBVar3;
  _Base_ptr p_Var4;
  key_type local_4;
  
  p_Var1 = &(this->backgrounds)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->backgrounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)type])
  {
    if ((int)type <= (int)p_Var2[1]._M_color) {
      p_Var4 = p_Var2;
    }
  }
  p_Var2 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var2 = p_Var4, (int)type < (int)p_Var4[1]._M_color)) {
    p_Var2 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    pBVar3 = ::std::
             map<Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background,_std::less<Rml::ElementBackgroundBorder::BackgroundType>,_std::allocator<std::pair<const_Rml::ElementBackgroundBorder::BackgroundType,_Rml::ElementBackgroundBorder::Background>_>_>
             ::operator[](&this->backgrounds,&local_4);
  }
  else {
    pBVar3 = (Background *)&p_Var2[1]._M_parent;
  }
  return pBVar3;
}

Assistant:

ElementBackgroundBorder::Background& ElementBackgroundBorder::GetOrCreateBackground(BackgroundType type)
{
	auto it = backgrounds.find(type);
	if (it != backgrounds.end())
		return it->second;

	Background& background = backgrounds[type];
	return background;
}